

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

int __thiscall server::gobang::quit(gobang *this,player *role)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  int *__k;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_server::player_*>_>,_std::_Rb_tree_iterator<std::pair<const_int,_server::player_*>_>_>
  pVar4;
  quit_ntf ntf;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined4 local_28;
  
  __k = &role->userid_;
  p_Var3 = (this->players_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->players_)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = &p_Var1->_M_header;
  if (p_Var3 != (_Base_ptr)0x0) {
    do {
      if (*__k <= (int)p_Var3[1]._M_color) {
        p_Var2 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < *__k];
    } while (p_Var3 != (_Base_ptr)0x0);
  }
  p_Var3 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var2 != p_Var1) && (p_Var3 = p_Var2, *__k < (int)p_Var2[1]._M_color)) {
    p_Var3 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var3 == p_Var1) {
    __assert_fail("players_.find(role->userid_) != players_.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jinjiazhang[P]protonet/sample/server.cpp"
                  ,0x4d,"int server::gobang::quit(player *)");
  }
  role->game_ = (gobang *)0x0;
  pVar4 = std::
          _Rb_tree<int,_std::pair<const_int,_server::player_*>,_std::_Select1st<std::pair<const_int,_server::player_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_server::player_*>_>_>
          ::equal_range(&(this->players_)._M_t,__k);
  std::
  _Rb_tree<int,_std::pair<const_int,_server::player_*>,_std::_Select1st<std::pair<const_int,_server::player_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_server::player_*>_>_>
  ::_M_erase_aux(&(this->players_)._M_t,(_Base_ptr)pVar4.first._M_node,
                 (_Base_ptr)pVar4.second._M_node);
  local_38 = 0;
  uStack_30 = 0;
  uStack_40 = 0;
  local_28 = 0;
  local_48 = (ulong)(uint)role->userid_;
  strcpy((char *)((long)&local_48 + 4),role->name_);
  broadcast(this,6,&local_48,0x24);
  if ((this->player1 == role) || (this->player2 == role)) {
    this->player1 = (player *)0x0;
    this->player2 = (player *)0x0;
    this->state_ = 3;
    sync_status(this,(player *)0x0);
  }
  return 0;
}

Assistant:

int quit(player* role) {
            assert(players_.find(role->userid_) != players_.end());
            role->set_game(nullptr);
            players_.erase(role->userid_);

            quit_ntf ntf = { 0 };
            ntf.userid = role->userid_;
            strcpy(ntf.name, role->name_);
            broadcast(MSG_QUIT_NTF, &ntf, sizeof(ntf));

            if (role == player1 || role == player2) {
                player1 = player2 = nullptr;
                state_ = STATE_ABORTED;
                sync_status();
            }

            return 0;
        }